

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O0

void initSQLData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  initializer_list<std::pair<char,_QLatin1String>_> list_01;
  QMultiHash<char,_QLatin1String> local_3da8;
  QLatin1String local_3d98;
  char local_3d81;
  QLatin1String local_3d80;
  char local_3d69;
  QLatin1String local_3d68;
  char local_3d51;
  QLatin1String local_3d50;
  char local_3d39;
  QLatin1String local_3d38;
  char local_3d21;
  QLatin1String local_3d20;
  char local_3d09;
  QLatin1String local_3d08;
  char local_3cf1;
  QLatin1String local_3cf0;
  char local_3cd9;
  QLatin1String local_3cd8;
  char local_3cc1;
  QLatin1String local_3cc0;
  char local_3ca9;
  QLatin1String local_3ca8;
  char local_3c91;
  QLatin1String local_3c90;
  char local_3c79;
  QLatin1String local_3c78;
  char local_3c61;
  QLatin1String local_3c60;
  char local_3c49;
  QLatin1String local_3c48;
  char local_3c31;
  pair<char,_QLatin1String> local_3c30;
  pair<char,_QLatin1String> pStack_3c18;
  pair<char,_QLatin1String> pStack_3c00;
  pair<char,_QLatin1String> pStack_3be8;
  pair<char,_QLatin1String> pStack_3bd0;
  pair<char,_QLatin1String> pStack_3bb8;
  pair<char,_QLatin1String> pStack_3ba0;
  pair<char,_QLatin1String> pStack_3b88;
  pair<char,_QLatin1String> pStack_3b70;
  pair<char,_QLatin1String> pStack_3b58;
  pair<char,_QLatin1String> pStack_3b40;
  pair<char,_QLatin1String> pStack_3b28;
  pair<char,_QLatin1String> pStack_3b10;
  pair<char,_QLatin1String> pStack_3af8;
  pair<char,_QLatin1String> pStack_3ae0;
  iterator local_3ac8;
  undefined8 local_3ac0;
  QMultiHash<char,_QLatin1String> local_3ab8;
  QLatin1String local_3aa8;
  char local_3a91;
  QLatin1String local_3a90;
  char local_3a79;
  QLatin1String local_3a78;
  char local_3a61;
  pair<char,_QLatin1String> local_3a60;
  pair<char,_QLatin1String> pStack_3a48;
  pair<char,_QLatin1String> pStack_3a30;
  iterator local_3a18;
  undefined8 local_3a10;
  QMultiHash<char,_QLatin1String> local_3a08;
  QMultiHash<char,_QLatin1String> local_39f8;
  QLatin1String local_39e8;
  char local_39d1;
  QLatin1String local_39d0;
  char local_39b9;
  QLatin1String local_39b8;
  char local_39a1;
  QLatin1String local_39a0;
  char local_3989;
  QLatin1String local_3988;
  char local_3971;
  QLatin1String local_3970;
  char local_3959;
  QLatin1String local_3958;
  char local_3941;
  QLatin1String local_3940;
  char local_3929;
  QLatin1String local_3928;
  char local_3911;
  QLatin1String local_3910;
  char local_38f9;
  QLatin1String local_38f8;
  char local_38e1;
  QLatin1String local_38e0;
  char local_38c9;
  QLatin1String local_38c8;
  char local_38b1;
  QLatin1String local_38b0;
  char local_3899;
  QLatin1String local_3898;
  char local_3881;
  QLatin1String local_3880;
  char local_3869;
  QLatin1String local_3868;
  char local_3851;
  QLatin1String local_3850;
  char local_3839;
  QLatin1String local_3838;
  char local_3821;
  QLatin1String local_3820;
  char local_3809;
  QLatin1String local_3808;
  char local_37f1;
  QLatin1String local_37f0;
  char local_37d9;
  QLatin1String local_37d8;
  char local_37c1;
  QLatin1String local_37c0;
  char local_37a9;
  QLatin1String local_37a8;
  char local_3791;
  QLatin1String local_3790;
  char local_3779;
  QLatin1String local_3778;
  char local_3761;
  QLatin1String local_3760;
  char local_3749;
  QLatin1String local_3748;
  char local_3731;
  QLatin1String local_3730;
  char local_3719;
  QLatin1String local_3718;
  char local_3701;
  QLatin1String local_3700;
  char local_36e9;
  QLatin1String local_36e8;
  char local_36d1;
  QLatin1String local_36d0;
  char local_36b9;
  QLatin1String local_36b8;
  char local_36a1;
  QLatin1String local_36a0;
  char local_3689;
  QLatin1String local_3688;
  char local_3671;
  QLatin1String local_3670;
  char local_3659;
  QLatin1String local_3658;
  char local_3641;
  QLatin1String local_3640;
  char local_3629;
  QLatin1String local_3628;
  char local_3611;
  QLatin1String local_3610;
  char local_35f9;
  QLatin1String local_35f8;
  char local_35e1;
  QLatin1String local_35e0;
  char local_35c9;
  QLatin1String local_35c8;
  char local_35b1;
  QLatin1String local_35b0;
  char local_3599;
  QLatin1String local_3598;
  char local_3581;
  QLatin1String local_3580;
  char local_3569;
  QLatin1String local_3568;
  char local_3551;
  QLatin1String local_3550;
  char local_3539;
  QLatin1String local_3538;
  char local_3521;
  QLatin1String local_3520;
  char local_3509;
  QLatin1String local_3508;
  char local_34f1;
  QLatin1String local_34f0;
  char local_34d9;
  QLatin1String local_34d8;
  char local_34c1;
  QLatin1String local_34c0;
  char local_34a9;
  QLatin1String local_34a8;
  char local_3491;
  QLatin1String local_3490;
  char local_3479;
  QLatin1String local_3478;
  char local_3461;
  QLatin1String local_3460;
  char local_3449;
  QLatin1String local_3448;
  char local_3431;
  QLatin1String local_3430;
  char local_3419;
  QLatin1String local_3418;
  char local_3401;
  QLatin1String local_3400;
  char local_33e9;
  QLatin1String local_33e8;
  char local_33d1;
  QLatin1String local_33d0;
  char local_33b9;
  QLatin1String local_33b8;
  char local_33a1;
  QLatin1String local_33a0;
  char local_3389;
  QLatin1String local_3388;
  char local_3371;
  QLatin1String local_3370;
  char local_3359;
  QLatin1String local_3358;
  char local_3341;
  QLatin1String local_3340;
  char local_3329;
  QLatin1String local_3328;
  char local_3311;
  QLatin1String local_3310;
  char local_32f9;
  QLatin1String local_32f8;
  char local_32e1;
  QLatin1String local_32e0;
  char local_32c9;
  QLatin1String local_32c8;
  char local_32b1;
  QLatin1String local_32b0;
  char local_3299;
  QLatin1String local_3298;
  char local_3281;
  QLatin1String local_3280;
  char local_3269;
  QLatin1String local_3268;
  char local_3251;
  QLatin1String local_3250;
  char local_3239;
  QLatin1String local_3238;
  char local_3221;
  QLatin1String local_3220;
  char local_3209;
  QLatin1String local_3208;
  char local_31f1;
  QLatin1String local_31f0;
  char local_31d9;
  QLatin1String local_31d8;
  char local_31c1;
  QLatin1String local_31c0;
  char local_31a9;
  QLatin1String local_31a8;
  char local_3191;
  QLatin1String local_3190;
  char local_3179;
  QLatin1String local_3178;
  char local_3161;
  QLatin1String local_3160;
  char local_3149;
  QLatin1String local_3148;
  char local_3131;
  QLatin1String local_3130;
  char local_3119;
  QLatin1String local_3118;
  char local_3101;
  QLatin1String local_3100;
  char local_30e9;
  QLatin1String local_30e8;
  char local_30d1;
  QLatin1String local_30d0;
  char local_30b9;
  QLatin1String local_30b8;
  char local_30a1;
  QLatin1String local_30a0;
  char local_3089;
  QLatin1String local_3088;
  char local_3071;
  QLatin1String local_3070;
  char local_3059;
  QLatin1String local_3058;
  char local_3041;
  QLatin1String local_3040;
  char local_3029;
  QLatin1String local_3028;
  char local_3011;
  QLatin1String local_3010;
  char local_2ff9;
  QLatin1String local_2ff8;
  char local_2fe1;
  QLatin1String local_2fe0;
  char local_2fc9;
  QLatin1String local_2fc8;
  char local_2fb1;
  QLatin1String local_2fb0;
  char local_2f99;
  QLatin1String local_2f98;
  char local_2f81;
  QLatin1String local_2f80;
  char local_2f69;
  QLatin1String local_2f68;
  char local_2f51;
  QLatin1String local_2f50;
  char local_2f39;
  QLatin1String local_2f38;
  char local_2f21;
  QLatin1String local_2f20;
  char local_2f09;
  QLatin1String local_2f08;
  char local_2ef1;
  QLatin1String local_2ef0;
  char local_2ed9;
  QLatin1String local_2ed8;
  char local_2ec1;
  QLatin1String local_2ec0;
  char local_2ea9;
  QLatin1String local_2ea8;
  char local_2e91;
  QLatin1String local_2e90;
  char local_2e79;
  QLatin1String local_2e78;
  char local_2e61;
  QLatin1String local_2e60;
  char local_2e49;
  QLatin1String local_2e48;
  char local_2e31;
  QLatin1String local_2e30;
  char local_2e19;
  QLatin1String local_2e18;
  char local_2e01;
  QLatin1String local_2e00;
  char local_2de9;
  QLatin1String local_2de8;
  char local_2dd1;
  QLatin1String local_2dd0;
  char local_2db9;
  QLatin1String local_2db8;
  char local_2da1;
  QLatin1String local_2da0;
  char local_2d89;
  QLatin1String local_2d88;
  char local_2d71;
  QLatin1String local_2d70;
  char local_2d59;
  QLatin1String local_2d58;
  char local_2d41;
  QLatin1String local_2d40;
  char local_2d29;
  QLatin1String local_2d28;
  char local_2d11;
  QLatin1String local_2d10;
  char local_2cf9;
  QLatin1String local_2cf8;
  char local_2ce1;
  QLatin1String local_2ce0;
  char local_2cc9;
  QLatin1String local_2cc8;
  char local_2cb1;
  QLatin1String local_2cb0;
  char local_2c99;
  QLatin1String local_2c98;
  char local_2c81;
  QLatin1String local_2c80;
  char local_2c69;
  QLatin1String local_2c68;
  char local_2c51;
  QLatin1String local_2c50;
  char local_2c39;
  QLatin1String local_2c38;
  char local_2c21;
  QLatin1String local_2c20;
  char local_2c09;
  QLatin1String local_2c08;
  char local_2bf1;
  QLatin1String local_2bf0;
  char local_2bd9;
  QLatin1String local_2bd8;
  char local_2bc1;
  QLatin1String local_2bc0;
  char local_2ba9;
  QLatin1String local_2ba8;
  char local_2b91;
  QLatin1String local_2b90;
  char local_2b79;
  QLatin1String local_2b78;
  char local_2b61;
  QLatin1String local_2b60;
  char local_2b49;
  QLatin1String local_2b48;
  char local_2b31;
  QLatin1String local_2b30;
  char local_2b19;
  QLatin1String local_2b18;
  char local_2b01;
  QLatin1String local_2b00;
  char local_2ae9;
  QLatin1String local_2ae8;
  char local_2ad1;
  QLatin1String local_2ad0;
  char local_2ab9;
  QLatin1String local_2ab8;
  char local_2aa1;
  QLatin1String local_2aa0;
  char local_2a89;
  QLatin1String local_2a88;
  char local_2a71;
  QLatin1String local_2a70;
  char local_2a59;
  QLatin1String local_2a58;
  char local_2a41;
  QLatin1String local_2a40;
  char local_2a29;
  QLatin1String local_2a28;
  char local_2a11;
  QLatin1String local_2a10;
  char local_29f9;
  QLatin1String local_29f8;
  char local_29e1;
  QLatin1String local_29e0;
  char local_29c9;
  QLatin1String local_29c8;
  char local_29b1;
  QLatin1String local_29b0;
  char local_2999;
  QLatin1String local_2998;
  char local_2981;
  QLatin1String local_2980;
  char local_2969;
  QLatin1String local_2968;
  char local_2951;
  QLatin1String local_2950;
  char local_2939;
  QLatin1String local_2938;
  char local_2921;
  QLatin1String local_2920;
  char local_2909;
  QLatin1String local_2908;
  char local_28f1;
  QLatin1String local_28f0;
  char local_28d9;
  QLatin1String local_28d8;
  char local_28c1;
  QLatin1String local_28c0;
  char local_28a9;
  QLatin1String local_28a8;
  char local_2891;
  QLatin1String local_2890;
  char local_2879;
  QLatin1String local_2878;
  char local_2861;
  QLatin1String local_2860;
  char local_2849;
  QLatin1String local_2848;
  char local_2831;
  QLatin1String local_2830;
  char local_2819;
  QLatin1String local_2818;
  char local_2801;
  QLatin1String local_2800;
  char local_27e9;
  QLatin1String local_27e8;
  char local_27d1;
  QLatin1String local_27d0;
  char local_27b9;
  QLatin1String local_27b8;
  char local_27a1;
  QLatin1String local_27a0;
  char local_2789;
  QLatin1String local_2788;
  char local_2771;
  QLatin1String local_2770;
  char local_2759;
  QLatin1String local_2758;
  char local_2741;
  QLatin1String local_2740;
  char local_2729;
  QLatin1String local_2728;
  char local_2711;
  QLatin1String local_2710;
  char local_26f9;
  QLatin1String local_26f8;
  char local_26e1;
  QLatin1String local_26e0;
  char local_26c9;
  QLatin1String local_26c8;
  char local_26b1;
  QLatin1String local_26b0;
  char local_2699;
  QLatin1String local_2698;
  char local_2681;
  QLatin1String local_2680;
  char local_2669;
  QLatin1String local_2668;
  char local_2651;
  QLatin1String local_2650;
  char local_2639;
  QLatin1String local_2638;
  char local_2621;
  QLatin1String local_2620;
  char local_2609;
  QLatin1String local_2608;
  char local_25f1;
  QLatin1String local_25f0;
  char local_25d9;
  QLatin1String local_25d8;
  char local_25c1;
  QLatin1String local_25c0;
  char local_25a9;
  QLatin1String local_25a8;
  char local_2591;
  QLatin1String local_2590;
  char local_2579;
  QLatin1String local_2578;
  char local_2561;
  QLatin1String local_2560;
  char local_2549;
  QLatin1String local_2548;
  char local_2531;
  QLatin1String local_2530;
  char local_2519;
  QLatin1String local_2518;
  char local_2501;
  QLatin1String local_2500;
  char local_24e9;
  QLatin1String local_24e8;
  char local_24d1;
  QLatin1String local_24d0;
  char local_24b9;
  QLatin1String local_24b8;
  char local_24a1;
  QLatin1String local_24a0;
  char local_2489;
  QLatin1String local_2488;
  char local_2471;
  QLatin1String local_2470;
  char local_2459;
  QLatin1String local_2458;
  char local_2441;
  QLatin1String local_2440;
  char local_2429;
  QLatin1String local_2428;
  char local_2411;
  QLatin1String local_2410;
  char local_23f9;
  QLatin1String local_23f8;
  char local_23e1;
  QLatin1String local_23e0;
  char local_23c9;
  QLatin1String local_23c8;
  char local_23b1;
  QLatin1String local_23b0;
  char local_2399;
  QLatin1String local_2398;
  char local_2381;
  QLatin1String local_2380;
  char local_2369;
  QLatin1String local_2368;
  char local_2351;
  QLatin1String local_2350;
  char local_2339;
  QLatin1String local_2338;
  char local_2321;
  QLatin1String local_2320;
  char local_2309;
  QLatin1String local_2308;
  char local_22f1;
  QLatin1String local_22f0;
  char local_22d9;
  QLatin1String local_22d8;
  char local_22c1;
  QLatin1String local_22c0;
  char local_22a9;
  QLatin1String local_22a8;
  char local_2291;
  QLatin1String local_2290;
  char local_2279;
  QLatin1String local_2278;
  char local_2261;
  QLatin1String local_2260;
  char local_2249;
  QLatin1String local_2248;
  char local_2231;
  QLatin1String local_2230;
  char local_2219;
  QLatin1String local_2218;
  char local_2201;
  QLatin1String local_2200;
  char local_21e9;
  QLatin1String local_21e8;
  char local_21d1;
  QLatin1String local_21d0;
  char local_21b9;
  QLatin1String local_21b8;
  char local_21a1;
  QLatin1String local_21a0;
  char local_2189;
  QLatin1String local_2188;
  char local_2171;
  QLatin1String local_2170;
  char local_2159;
  QLatin1String local_2158;
  char local_2141;
  QLatin1String local_2140;
  char local_2129;
  QLatin1String local_2128;
  char local_2111;
  QLatin1String local_2110;
  char local_20f9;
  QLatin1String local_20f8;
  char local_20e1;
  QLatin1String local_20e0;
  char local_20c9;
  QLatin1String local_20c8;
  char local_20b1;
  QLatin1String local_20b0;
  char local_2099;
  QLatin1String local_2098;
  char local_2081;
  QLatin1String local_2080;
  char local_2069;
  QLatin1String local_2068;
  char local_2051;
  QLatin1String local_2050;
  char local_2039;
  QLatin1String local_2038;
  char local_2021;
  QLatin1String local_2020;
  char local_2009;
  QLatin1String local_2008;
  char local_1ff1;
  QLatin1String local_1ff0;
  char local_1fd9;
  QLatin1String local_1fd8;
  char local_1fc1;
  QLatin1String local_1fc0;
  char local_1fa9;
  QLatin1String local_1fa8;
  char local_1f91;
  QLatin1String local_1f90;
  char local_1f79;
  QLatin1String local_1f78;
  char local_1f61;
  QLatin1String local_1f60;
  char local_1f49;
  QLatin1String local_1f48;
  char local_1f31;
  QLatin1String local_1f30;
  char local_1f19;
  QLatin1String local_1f18;
  char local_1f01;
  QLatin1String local_1f00;
  char local_1ee9;
  QLatin1String local_1ee8;
  char local_1ed1;
  QLatin1String local_1ed0;
  char local_1eb9;
  QLatin1String local_1eb8;
  char local_1ea1;
  QLatin1String local_1ea0;
  char local_1e89;
  QLatin1String local_1e88;
  char local_1e71;
  QLatin1String local_1e70;
  char local_1e59;
  QLatin1String local_1e58;
  char local_1e41;
  QLatin1String local_1e40;
  char local_1e29;
  QLatin1String local_1e28;
  char local_1e11;
  QLatin1String local_1e10;
  char local_1df9;
  QLatin1String local_1df8;
  char local_1de1;
  QLatin1String local_1de0;
  char local_1dc9;
  QLatin1String local_1dc8;
  char local_1db1;
  QLatin1String local_1db0;
  char local_1d99;
  QLatin1String local_1d98;
  char local_1d81;
  QLatin1String local_1d80;
  char local_1d69;
  QLatin1String local_1d68;
  char local_1d51;
  QLatin1String local_1d50;
  char local_1d39;
  QLatin1String local_1d38;
  char local_1d21;
  QLatin1String local_1d20;
  char local_1d09;
  pair<char,_QLatin1String> local_1d08;
  pair<char,_QLatin1String> pStack_1cf0;
  pair<char,_QLatin1String> pStack_1cd8;
  pair<char,_QLatin1String> pStack_1cc0;
  pair<char,_QLatin1String> pStack_1ca8;
  pair<char,_QLatin1String> pStack_1c90;
  pair<char,_QLatin1String> pStack_1c78;
  pair<char,_QLatin1String> pStack_1c60;
  pair<char,_QLatin1String> pStack_1c48;
  pair<char,_QLatin1String> pStack_1c30;
  pair<char,_QLatin1String> pStack_1c18;
  pair<char,_QLatin1String> pStack_1c00;
  pair<char,_QLatin1String> pStack_1be8;
  pair<char,_QLatin1String> pStack_1bd0;
  pair<char,_QLatin1String> pStack_1bb8;
  pair<char,_QLatin1String> pStack_1ba0;
  pair<char,_QLatin1String> pStack_1b88;
  pair<char,_QLatin1String> pStack_1b70;
  pair<char,_QLatin1String> pStack_1b58;
  pair<char,_QLatin1String> pStack_1b40;
  pair<char,_QLatin1String> pStack_1b28;
  pair<char,_QLatin1String> pStack_1b10;
  pair<char,_QLatin1String> pStack_1af8;
  pair<char,_QLatin1String> pStack_1ae0;
  pair<char,_QLatin1String> pStack_1ac8;
  pair<char,_QLatin1String> pStack_1ab0;
  pair<char,_QLatin1String> pStack_1a98;
  pair<char,_QLatin1String> pStack_1a80;
  pair<char,_QLatin1String> pStack_1a68;
  pair<char,_QLatin1String> pStack_1a50;
  pair<char,_QLatin1String> pStack_1a38;
  pair<char,_QLatin1String> pStack_1a20;
  pair<char,_QLatin1String> pStack_1a08;
  pair<char,_QLatin1String> pStack_19f0;
  pair<char,_QLatin1String> pStack_19d8;
  pair<char,_QLatin1String> pStack_19c0;
  pair<char,_QLatin1String> pStack_19a8;
  pair<char,_QLatin1String> pStack_1990;
  pair<char,_QLatin1String> pStack_1978;
  pair<char,_QLatin1String> pStack_1960;
  pair<char,_QLatin1String> pStack_1948;
  pair<char,_QLatin1String> pStack_1930;
  pair<char,_QLatin1String> pStack_1918;
  pair<char,_QLatin1String> pStack_1900;
  pair<char,_QLatin1String> pStack_18e8;
  pair<char,_QLatin1String> pStack_18d0;
  pair<char,_QLatin1String> pStack_18b8;
  pair<char,_QLatin1String> pStack_18a0;
  pair<char,_QLatin1String> pStack_1888;
  pair<char,_QLatin1String> pStack_1870;
  pair<char,_QLatin1String> pStack_1858;
  pair<char,_QLatin1String> pStack_1840;
  pair<char,_QLatin1String> pStack_1828;
  pair<char,_QLatin1String> pStack_1810;
  pair<char,_QLatin1String> pStack_17f8;
  pair<char,_QLatin1String> pStack_17e0;
  pair<char,_QLatin1String> pStack_17c8;
  pair<char,_QLatin1String> pStack_17b0;
  pair<char,_QLatin1String> pStack_1798;
  pair<char,_QLatin1String> pStack_1780;
  pair<char,_QLatin1String> pStack_1768;
  pair<char,_QLatin1String> pStack_1750;
  pair<char,_QLatin1String> pStack_1738;
  pair<char,_QLatin1String> pStack_1720;
  pair<char,_QLatin1String> pStack_1708;
  pair<char,_QLatin1String> pStack_16f0;
  pair<char,_QLatin1String> pStack_16d8;
  pair<char,_QLatin1String> pStack_16c0;
  pair<char,_QLatin1String> pStack_16a8;
  pair<char,_QLatin1String> pStack_1690;
  pair<char,_QLatin1String> pStack_1678;
  pair<char,_QLatin1String> pStack_1660;
  pair<char,_QLatin1String> pStack_1648;
  pair<char,_QLatin1String> pStack_1630;
  pair<char,_QLatin1String> pStack_1618;
  pair<char,_QLatin1String> pStack_1600;
  pair<char,_QLatin1String> pStack_15e8;
  pair<char,_QLatin1String> pStack_15d0;
  pair<char,_QLatin1String> pStack_15b8;
  pair<char,_QLatin1String> pStack_15a0;
  pair<char,_QLatin1String> pStack_1588;
  pair<char,_QLatin1String> pStack_1570;
  pair<char,_QLatin1String> pStack_1558;
  pair<char,_QLatin1String> pStack_1540;
  pair<char,_QLatin1String> pStack_1528;
  pair<char,_QLatin1String> pStack_1510;
  pair<char,_QLatin1String> pStack_14f8;
  pair<char,_QLatin1String> pStack_14e0;
  pair<char,_QLatin1String> pStack_14c8;
  pair<char,_QLatin1String> pStack_14b0;
  pair<char,_QLatin1String> pStack_1498;
  pair<char,_QLatin1String> pStack_1480;
  pair<char,_QLatin1String> pStack_1468;
  pair<char,_QLatin1String> pStack_1450;
  pair<char,_QLatin1String> pStack_1438;
  pair<char,_QLatin1String> pStack_1420;
  pair<char,_QLatin1String> pStack_1408;
  pair<char,_QLatin1String> pStack_13f0;
  pair<char,_QLatin1String> pStack_13d8;
  pair<char,_QLatin1String> pStack_13c0;
  pair<char,_QLatin1String> pStack_13a8;
  pair<char,_QLatin1String> pStack_1390;
  pair<char,_QLatin1String> pStack_1378;
  pair<char,_QLatin1String> pStack_1360;
  pair<char,_QLatin1String> pStack_1348;
  pair<char,_QLatin1String> pStack_1330;
  pair<char,_QLatin1String> pStack_1318;
  pair<char,_QLatin1String> pStack_1300;
  pair<char,_QLatin1String> pStack_12e8;
  pair<char,_QLatin1String> pStack_12d0;
  pair<char,_QLatin1String> pStack_12b8;
  pair<char,_QLatin1String> pStack_12a0;
  pair<char,_QLatin1String> pStack_1288;
  pair<char,_QLatin1String> pStack_1270;
  pair<char,_QLatin1String> pStack_1258;
  pair<char,_QLatin1String> pStack_1240;
  pair<char,_QLatin1String> pStack_1228;
  pair<char,_QLatin1String> pStack_1210;
  pair<char,_QLatin1String> pStack_11f8;
  pair<char,_QLatin1String> pStack_11e0;
  pair<char,_QLatin1String> pStack_11c8;
  pair<char,_QLatin1String> pStack_11b0;
  pair<char,_QLatin1String> pStack_1198;
  pair<char,_QLatin1String> pStack_1180;
  pair<char,_QLatin1String> pStack_1168;
  pair<char,_QLatin1String> pStack_1150;
  pair<char,_QLatin1String> pStack_1138;
  pair<char,_QLatin1String> pStack_1120;
  pair<char,_QLatin1String> pStack_1108;
  pair<char,_QLatin1String> pStack_10f0;
  pair<char,_QLatin1String> pStack_10d8;
  pair<char,_QLatin1String> pStack_10c0;
  pair<char,_QLatin1String> pStack_10a8;
  pair<char,_QLatin1String> pStack_1090;
  pair<char,_QLatin1String> pStack_1078;
  pair<char,_QLatin1String> pStack_1060;
  pair<char,_QLatin1String> pStack_1048;
  pair<char,_QLatin1String> pStack_1030;
  pair<char,_QLatin1String> pStack_1018;
  pair<char,_QLatin1String> pStack_1000;
  pair<char,_QLatin1String> pStack_fe8;
  pair<char,_QLatin1String> pStack_fd0;
  pair<char,_QLatin1String> pStack_fb8;
  pair<char,_QLatin1String> pStack_fa0;
  pair<char,_QLatin1String> pStack_f88;
  pair<char,_QLatin1String> pStack_f70;
  pair<char,_QLatin1String> pStack_f58;
  pair<char,_QLatin1String> pStack_f40;
  pair<char,_QLatin1String> pStack_f28;
  pair<char,_QLatin1String> pStack_f10;
  pair<char,_QLatin1String> pStack_ef8;
  pair<char,_QLatin1String> pStack_ee0;
  pair<char,_QLatin1String> pStack_ec8;
  pair<char,_QLatin1String> pStack_eb0;
  pair<char,_QLatin1String> pStack_e98;
  pair<char,_QLatin1String> pStack_e80;
  pair<char,_QLatin1String> pStack_e68;
  pair<char,_QLatin1String> pStack_e50;
  pair<char,_QLatin1String> pStack_e38;
  pair<char,_QLatin1String> pStack_e20;
  pair<char,_QLatin1String> pStack_e08;
  pair<char,_QLatin1String> pStack_df0;
  pair<char,_QLatin1String> pStack_dd8;
  pair<char,_QLatin1String> pStack_dc0;
  pair<char,_QLatin1String> pStack_da8;
  pair<char,_QLatin1String> pStack_d90;
  pair<char,_QLatin1String> pStack_d78;
  pair<char,_QLatin1String> pStack_d60;
  pair<char,_QLatin1String> pStack_d48;
  pair<char,_QLatin1String> pStack_d30;
  pair<char,_QLatin1String> pStack_d18;
  pair<char,_QLatin1String> pStack_d00;
  pair<char,_QLatin1String> pStack_ce8;
  pair<char,_QLatin1String> pStack_cd0;
  pair<char,_QLatin1String> pStack_cb8;
  pair<char,_QLatin1String> pStack_ca0;
  pair<char,_QLatin1String> pStack_c88;
  pair<char,_QLatin1String> pStack_c70;
  pair<char,_QLatin1String> pStack_c58;
  pair<char,_QLatin1String> pStack_c40;
  pair<char,_QLatin1String> pStack_c28;
  pair<char,_QLatin1String> pStack_c10;
  pair<char,_QLatin1String> pStack_bf8;
  pair<char,_QLatin1String> pStack_be0;
  pair<char,_QLatin1String> pStack_bc8;
  pair<char,_QLatin1String> pStack_bb0;
  pair<char,_QLatin1String> pStack_b98;
  pair<char,_QLatin1String> pStack_b80;
  pair<char,_QLatin1String> pStack_b68;
  pair<char,_QLatin1String> pStack_b50;
  pair<char,_QLatin1String> pStack_b38;
  pair<char,_QLatin1String> pStack_b20;
  pair<char,_QLatin1String> pStack_b08;
  pair<char,_QLatin1String> pStack_af0;
  pair<char,_QLatin1String> pStack_ad8;
  pair<char,_QLatin1String> pStack_ac0;
  pair<char,_QLatin1String> pStack_aa8;
  pair<char,_QLatin1String> pStack_a90;
  pair<char,_QLatin1String> pStack_a78;
  pair<char,_QLatin1String> pStack_a60;
  pair<char,_QLatin1String> pStack_a48;
  pair<char,_QLatin1String> pStack_a30;
  pair<char,_QLatin1String> pStack_a18;
  pair<char,_QLatin1String> pStack_a00;
  pair<char,_QLatin1String> pStack_9e8;
  pair<char,_QLatin1String> pStack_9d0;
  pair<char,_QLatin1String> pStack_9b8;
  pair<char,_QLatin1String> pStack_9a0;
  pair<char,_QLatin1String> pStack_988;
  pair<char,_QLatin1String> pStack_970;
  pair<char,_QLatin1String> pStack_958;
  pair<char,_QLatin1String> pStack_940;
  pair<char,_QLatin1String> pStack_928;
  pair<char,_QLatin1String> pStack_910;
  pair<char,_QLatin1String> pStack_8f8;
  pair<char,_QLatin1String> pStack_8e0;
  pair<char,_QLatin1String> pStack_8c8;
  pair<char,_QLatin1String> pStack_8b0;
  pair<char,_QLatin1String> pStack_898;
  pair<char,_QLatin1String> pStack_880;
  pair<char,_QLatin1String> pStack_868;
  pair<char,_QLatin1String> pStack_850;
  pair<char,_QLatin1String> pStack_838;
  pair<char,_QLatin1String> pStack_820;
  pair<char,_QLatin1String> pStack_808;
  pair<char,_QLatin1String> pStack_7f0;
  pair<char,_QLatin1String> pStack_7d8;
  pair<char,_QLatin1String> pStack_7c0;
  pair<char,_QLatin1String> pStack_7a8;
  pair<char,_QLatin1String> pStack_790;
  pair<char,_QLatin1String> pStack_778;
  pair<char,_QLatin1String> pStack_760;
  pair<char,_QLatin1String> pStack_748;
  pair<char,_QLatin1String> pStack_730;
  pair<char,_QLatin1String> pStack_718;
  pair<char,_QLatin1String> pStack_700;
  pair<char,_QLatin1String> pStack_6e8;
  pair<char,_QLatin1String> pStack_6d0;
  pair<char,_QLatin1String> pStack_6b8;
  pair<char,_QLatin1String> pStack_6a0;
  pair<char,_QLatin1String> pStack_688;
  pair<char,_QLatin1String> pStack_670;
  pair<char,_QLatin1String> pStack_658;
  pair<char,_QLatin1String> pStack_640;
  pair<char,_QLatin1String> pStack_628;
  pair<char,_QLatin1String> pStack_610;
  pair<char,_QLatin1String> pStack_5f8;
  pair<char,_QLatin1String> pStack_5e0;
  pair<char,_QLatin1String> pStack_5c8;
  pair<char,_QLatin1String> pStack_5b0;
  pair<char,_QLatin1String> pStack_598;
  pair<char,_QLatin1String> pStack_580;
  pair<char,_QLatin1String> pStack_568;
  pair<char,_QLatin1String> pStack_550;
  pair<char,_QLatin1String> pStack_538;
  pair<char,_QLatin1String> pStack_520;
  pair<char,_QLatin1String> pStack_508;
  pair<char,_QLatin1String> pStack_4f0;
  pair<char,_QLatin1String> pStack_4d8;
  pair<char,_QLatin1String> pStack_4c0;
  pair<char,_QLatin1String> pStack_4a8;
  pair<char,_QLatin1String> pStack_490;
  pair<char,_QLatin1String> pStack_478;
  pair<char,_QLatin1String> pStack_460;
  pair<char,_QLatin1String> pStack_448;
  pair<char,_QLatin1String> pStack_430;
  pair<char,_QLatin1String> pStack_418;
  pair<char,_QLatin1String> pStack_400;
  pair<char,_QLatin1String> pStack_3e8;
  pair<char,_QLatin1String> pStack_3d0;
  pair<char,_QLatin1String> pStack_3b8;
  pair<char,_QLatin1String> pStack_3a0;
  pair<char,_QLatin1String> pStack_388;
  pair<char,_QLatin1String> pStack_370;
  pair<char,_QLatin1String> pStack_358;
  pair<char,_QLatin1String> pStack_340;
  pair<char,_QLatin1String> pStack_328;
  pair<char,_QLatin1String> pStack_310;
  pair<char,_QLatin1String> pStack_2f8;
  pair<char,_QLatin1String> pStack_2e0;
  pair<char,_QLatin1String> pStack_2c8;
  pair<char,_QLatin1String> pStack_2b0;
  pair<char,_QLatin1String> pStack_298;
  pair<char,_QLatin1String> pStack_280;
  pair<char,_QLatin1String> pStack_268;
  pair<char,_QLatin1String> pStack_250;
  pair<char,_QLatin1String> pStack_238;
  pair<char,_QLatin1String> pStack_220;
  pair<char,_QLatin1String> pStack_208;
  pair<char,_QLatin1String> pStack_1f0;
  pair<char,_QLatin1String> pStack_1d8;
  pair<char,_QLatin1String> pStack_1c0;
  pair<char,_QLatin1String> pStack_1a8;
  pair<char,_QLatin1String> pStack_190;
  pair<char,_QLatin1String> pStack_178;
  pair<char,_QLatin1String> pStack_160;
  pair<char,_QLatin1String> pStack_148;
  pair<char,_QLatin1String> pStack_130;
  pair<char,_QLatin1String> pStack_118;
  pair<char,_QLatin1String> pStack_100;
  pair<char,_QLatin1String> pStack_e8;
  pair<char,_QLatin1String> pStack_d0;
  pair<char,_QLatin1String> pStack_b8;
  pair<char,_QLatin1String> pStack_a0;
  pair<char,_QLatin1String> pStack_88;
  pair<char,_QLatin1String> pStack_70;
  pair<char,_QLatin1String> pStack_58;
  pair<char,_QLatin1String> pStack_40;
  iterator local_28;
  undefined8 local_20;
  QMultiHash<char,_QLatin1String> local_18;
  
  local_1d09 = 'A';
  QLatin1String::QLatin1String(&local_1d20,"ACTION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&local_1d08,&local_1d09,&local_1d20);
  local_1d21 = 'A';
  QLatin1String::QLatin1String(&local_1d38,"ADD");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1cf0,&local_1d21,&local_1d38);
  local_1d39 = 'A';
  QLatin1String::QLatin1String(&local_1d50,"AFTER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1cd8,&local_1d39,&local_1d50);
  local_1d51 = 'A';
  QLatin1String::QLatin1String(&local_1d68,"ALGORITHM");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1cc0,&local_1d51,&local_1d68);
  local_1d69 = 'A';
  QLatin1String::QLatin1String(&local_1d80,"ALL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1ca8,&local_1d69,&local_1d80);
  local_1d81 = 'A';
  QLatin1String::QLatin1String(&local_1d98,"ALTER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1c90,&local_1d81,&local_1d98);
  local_1d99 = 'A';
  QLatin1String::QLatin1String(&local_1db0,"ANALYZE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1c78,&local_1d99,&local_1db0);
  local_1db1 = 'A';
  QLatin1String::QLatin1String(&local_1dc8,"ANY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1c60,&local_1db1,&local_1dc8);
  local_1dc9 = 'A';
  QLatin1String::QLatin1String(&local_1de0,"APPLY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1c48,&local_1dc9,&local_1de0);
  local_1de1 = 'A';
  QLatin1String::QLatin1String(&local_1df8,"AS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1c30,&local_1de1,&local_1df8);
  local_1df9 = 'A';
  QLatin1String::QLatin1String(&local_1e10,"ASC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1c18,&local_1df9,&local_1e10);
  local_1e11 = 'A';
  QLatin1String::QLatin1String(&local_1e28,"AUTHORIZATION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1c00,&local_1e11,&local_1e28);
  local_1e29 = 'A';
  QLatin1String::QLatin1String(&local_1e40,"AUTO_INCREMENT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1be8,&local_1e29,&local_1e40);
  local_1e41 = 'B';
  QLatin1String::QLatin1String(&local_1e58,"BACKUP");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1bd0,&local_1e41,&local_1e58);
  local_1e59 = 'B';
  QLatin1String::QLatin1String(&local_1e70,"BDB");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1bb8,&local_1e59,&local_1e70);
  local_1e71 = 'B';
  QLatin1String::QLatin1String(&local_1e88,"BEGIN");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1ba0,&local_1e71,&local_1e88);
  local_1e89 = 'B';
  QLatin1String::QLatin1String(&local_1ea0,"BERKELEYDB");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1b88,&local_1e89,&local_1ea0);
  local_1ea1 = 'B';
  QLatin1String::QLatin1String(&local_1eb8,"BIGINT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1b70,&local_1ea1,&local_1eb8);
  local_1eb9 = 'B';
  QLatin1String::QLatin1String(&local_1ed0,"BINARY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1b58,&local_1eb9,&local_1ed0);
  local_1ed1 = 'B';
  QLatin1String::QLatin1String(&local_1ee8,"BIT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1b40,&local_1ed1,&local_1ee8);
  local_1ee9 = 'B';
  QLatin1String::QLatin1String(&local_1f00,"BLOB");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1b28,&local_1ee9,&local_1f00);
  local_1f01 = 'B';
  QLatin1String::QLatin1String(&local_1f18,"BOOL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1b10,&local_1f01,&local_1f18);
  local_1f19 = 'B';
  QLatin1String::QLatin1String(&local_1f30,"BOOLEAN");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1af8,&local_1f19,&local_1f30);
  local_1f31 = 'B';
  QLatin1String::QLatin1String(&local_1f48,"BREAK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1ae0,&local_1f31,&local_1f48);
  local_1f49 = 'B';
  QLatin1String::QLatin1String(&local_1f60,"BROWSE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1ac8,&local_1f49,&local_1f60);
  local_1f61 = 'B';
  QLatin1String::QLatin1String(&local_1f78,"BTREE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1ab0,&local_1f61,&local_1f78);
  local_1f79 = 'B';
  QLatin1String::QLatin1String(&local_1f90,"BULK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1a98,&local_1f79,&local_1f90);
  local_1f91 = 'B';
  QLatin1String::QLatin1String(&local_1fa8,"BY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1a80,&local_1f91,&local_1fa8);
  local_1fa9 = 'C';
  QLatin1String::QLatin1String(&local_1fc0,"CALL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1a68,&local_1fa9,&local_1fc0);
  local_1fc1 = 'C';
  QLatin1String::QLatin1String(&local_1fd8,"CASCADED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1a50,&local_1fc1,&local_1fd8);
  local_1fd9 = 'C';
  QLatin1String::QLatin1String(&local_1ff0,"CASE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1a38,&local_1fd9,&local_1ff0);
  local_1ff1 = 'C';
  QLatin1String::QLatin1String(&local_2008,"CHAIN");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1a20,&local_1ff1,&local_2008);
  local_2009 = 'C';
  QLatin1String::QLatin1String(&local_2020,"CHARACTER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1a08,&local_2009,&local_2020);
  local_2021 = 'S';
  QLatin1String::QLatin1String(&local_2038,"SET");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_19f0,&local_2021,&local_2038);
  local_2039 = 'C';
  QLatin1String::QLatin1String(&local_2050,"CHECKPOINT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_19d8,&local_2039,&local_2050);
  local_2051 = 'C';
  QLatin1String::QLatin1String(&local_2068,"CLOSE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_19c0,&local_2051,&local_2068);
  local_2069 = 'C';
  QLatin1String::QLatin1String(&local_2080,"CLUSTERED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_19a8,&local_2069,&local_2080);
  local_2081 = 'C';
  QLatin1String::QLatin1String(&local_2098,"COALESCE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1990,&local_2081,&local_2098);
  local_2099 = 'C';
  QLatin1String::QLatin1String(&local_20b0,"COLLATE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1978,&local_2099,&local_20b0);
  local_20b1 = 'C';
  QLatin1String::QLatin1String(&local_20c8,"COLUMNS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1960,&local_20b1,&local_20c8);
  local_20c9 = 'C';
  QLatin1String::QLatin1String(&local_20e0,"COMMENT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1948,&local_20c9,&local_20e0);
  local_20e1 = 'C';
  QLatin1String::QLatin1String(&local_20f8,"COMMITTED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1930,&local_20e1,&local_20f8);
  local_20f9 = 'C';
  QLatin1String::QLatin1String(&local_2110,"COMPUTE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1918,&local_20f9,&local_2110);
  local_2111 = 'C';
  QLatin1String::QLatin1String(&local_2128,"CONNECT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1900,&local_2111,&local_2128);
  local_2129 = 'C';
  QLatin1String::QLatin1String(&local_2140,"CONSISTENT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_18e8,&local_2129,&local_2140);
  local_2141 = 'C';
  QLatin1String::QLatin1String(&local_2158,"CONSTRAINT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_18d0,&local_2141,&local_2158);
  local_2159 = 'C';
  QLatin1String::QLatin1String(&local_2170,"CONTAINSTABLE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_18b8,&local_2159,&local_2170);
  local_2171 = 'C';
  QLatin1String::QLatin1String(&local_2188,"CONTINUE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_18a0,&local_2171,&local_2188);
  local_2189 = 'C';
  QLatin1String::QLatin1String(&local_21a0,"CONVERT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1888,&local_2189,&local_21a0);
  local_21a1 = 'C';
  QLatin1String::QLatin1String(&local_21b8,"CREATE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1870,&local_21a1,&local_21b8);
  local_21b9 = 'C';
  QLatin1String::QLatin1String(&local_21d0,"CROSS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1858,&local_21b9,&local_21d0);
  local_21d1 = 'C';
  QLatin1String::QLatin1String(&local_21e8,"CURRENT_DATE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1840,&local_21d1,&local_21e8);
  local_21e9 = '_';
  QLatin1String::QLatin1String(&local_2200,"_TIME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1828,&local_21e9,&local_2200);
  local_2201 = '_';
  QLatin1String::QLatin1String(&local_2218,"_TIMESTAMP");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1810,&local_2201,&local_2218);
  local_2219 = '_';
  QLatin1String::QLatin1String(&local_2230,"_USER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_17f8,&local_2219,&local_2230);
  local_2231 = 'C';
  QLatin1String::QLatin1String(&local_2248,"CURSOR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_17e0,&local_2231,&local_2248);
  local_2249 = 'C';
  QLatin1String::QLatin1String(&local_2260,"CYCLE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_17c8,&local_2249,&local_2260);
  local_2261 = 'D';
  QLatin1String::QLatin1String(&local_2278,"DATABASES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_17b0,&local_2261,&local_2278);
  local_2279 = 'D';
  QLatin1String::QLatin1String(&local_2290,"DATETIME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1798,&local_2279,&local_2290);
  local_2291 = 'D';
  QLatin1String::QLatin1String(&local_22a8,"DAY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1780,&local_2291,&local_22a8);
  local_22a9 = 'D';
  QLatin1String::QLatin1String(&local_22c0,"DBCC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1768,&local_22a9,&local_22c0);
  local_22c1 = 'D';
  QLatin1String::QLatin1String(&local_22d8,"DEALLOCATE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1750,&local_22c1,&local_22d8);
  local_22d9 = 'D';
  QLatin1String::QLatin1String(&local_22f0,"DEC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1738,&local_22d9,&local_22f0);
  local_22f1 = 'D';
  QLatin1String::QLatin1String(&local_2308,"DECIMAL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1720,&local_22f1,&local_2308);
  local_2309 = 'D';
  QLatin1String::QLatin1String(&local_2320,"DECLARE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1708,&local_2309,&local_2320);
  local_2321 = 'D';
  QLatin1String::QLatin1String(&local_2338,"DEFAULT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_16f0,&local_2321,&local_2338);
  local_2339 = 'D';
  QLatin1String::QLatin1String(&local_2350,"DEFINER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_16d8,&local_2339,&local_2350);
  local_2351 = 'D';
  QLatin1String::QLatin1String(&local_2368,"DELAYED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_16c0,&local_2351,&local_2368);
  local_2369 = 'D';
  QLatin1String::QLatin1String(&local_2380,"DELETE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_16a8,&local_2369,&local_2380);
  local_2381 = 'D';
  QLatin1String::QLatin1String(&local_2398,"DELIMITERS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1690,&local_2381,&local_2398);
  local_2399 = 'D';
  QLatin1String::QLatin1String(&local_23b0,"DENY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1678,&local_2399,&local_23b0);
  local_23b1 = 'D';
  QLatin1String::QLatin1String(&local_23c8,"DESC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1660,&local_23b1,&local_23c8);
  local_23c9 = 'D';
  QLatin1String::QLatin1String(&local_23e0,"DESCRIBE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1648,&local_23c9,&local_23e0);
  local_23e1 = 'D';
  QLatin1String::QLatin1String(&local_23f8,"DETERMINISTIC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1630,&local_23e1,&local_23f8);
  local_23f9 = 'D';
  QLatin1String::QLatin1String(&local_2410,"DISABLE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1618,&local_23f9,&local_2410);
  local_2411 = 'D';
  QLatin1String::QLatin1String(&local_2428,"DISCARD");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1600,&local_2411,&local_2428);
  local_2429 = 'D';
  QLatin1String::QLatin1String(&local_2440,"DISK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_15e8,&local_2429,&local_2440);
  local_2441 = 'D';
  QLatin1String::QLatin1String(&local_2458,"DISTINCT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_15d0,&local_2441,&local_2458);
  local_2459 = 'D';
  QLatin1String::QLatin1String(&local_2470,"DISTINCTROW");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_15b8,&local_2459,&local_2470);
  local_2471 = 'D';
  QLatin1String::QLatin1String(&local_2488,"DISTRIBUTED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_15a0,&local_2471,&local_2488);
  local_2489 = 'D';
  QLatin1String::QLatin1String(&local_24a0,"DO");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1588,&local_2489,&local_24a0);
  local_24a1 = 'D';
  QLatin1String::QLatin1String(&local_24b8,"DOUBLE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1570,&local_24a1,&local_24b8);
  local_24b9 = 'D';
  QLatin1String::QLatin1String(&local_24d0,"DROP");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1558,&local_24b9,&local_24d0);
  local_24d1 = 'D';
  QLatin1String::QLatin1String(&local_24e8,"DUMMY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1540,&local_24d1,&local_24e8);
  local_24e9 = 'D';
  QLatin1String::QLatin1String(&local_2500,"DUMPFILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1528,&local_24e9,&local_2500);
  local_2501 = 'D';
  QLatin1String::QLatin1String(&local_2518,"DUPLICATE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1510,&local_2501,&local_2518);
  local_2519 = 'E';
  QLatin1String::QLatin1String(&local_2530,"ELSEIF");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_14f8,&local_2519,&local_2530);
  local_2531 = 'E';
  QLatin1String::QLatin1String(&local_2548,"ENABLE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_14e0,&local_2531,&local_2548);
  local_2549 = 'E';
  QLatin1String::QLatin1String(&local_2560,"ENCLOSED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_14c8,&local_2549,&local_2560);
  local_2561 = 'E';
  QLatin1String::QLatin1String(&local_2578,"END");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_14b0,&local_2561,&local_2578);
  local_2579 = 'E';
  QLatin1String::QLatin1String(&local_2590,"ENGINE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1498,&local_2579,&local_2590);
  local_2591 = 'E';
  QLatin1String::QLatin1String(&local_25a8,"ENUM");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1480,&local_2591,&local_25a8);
  local_25a9 = 'E';
  QLatin1String::QLatin1String(&local_25c0,"ERRLVL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1468,&local_25a9,&local_25c0);
  local_25c1 = 'E';
  QLatin1String::QLatin1String(&local_25d8,"ERRORS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1450,&local_25c1,&local_25d8);
  local_25d9 = 'E';
  QLatin1String::QLatin1String(&local_25f0,"ESCAPED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1438,&local_25d9,&local_25f0);
  local_25f1 = 'E';
  QLatin1String::QLatin1String(&local_2608,"EXCEPT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1420,&local_25f1,&local_2608);
  local_2609 = 'E';
  QLatin1String::QLatin1String(&local_2620,"EXECUTE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1408,&local_2609,&local_2620);
  local_2621 = 'E';
  QLatin1String::QLatin1String(&local_2638,"EXISTS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_13f0,&local_2621,&local_2638);
  local_2639 = 'E';
  QLatin1String::QLatin1String(&local_2650,"EXIT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_13d8,&local_2639,&local_2650);
  local_2651 = 'E';
  QLatin1String::QLatin1String(&local_2668,"EXPLAIN");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_13c0,&local_2651,&local_2668);
  local_2669 = 'E';
  QLatin1String::QLatin1String(&local_2680,"EXTENDED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_13a8,&local_2669,&local_2680);
  local_2681 = 'F';
  QLatin1String::QLatin1String(&local_2698,"FETCH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1390,&local_2681,&local_2698);
  local_2699 = 'F';
  QLatin1String::QLatin1String(&local_26b0,"FIELDS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1378,&local_2699,&local_26b0);
  local_26b1 = 'F';
  QLatin1String::QLatin1String(&local_26c8,"FILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1360,&local_26b1,&local_26c8);
  local_26c9 = 'F';
  QLatin1String::QLatin1String(&local_26e0,"FILLFACTOR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1348,&local_26c9,&local_26e0);
  local_26e1 = 'F';
  QLatin1String::QLatin1String(&local_26f8,"FIRST");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1330,&local_26e1,&local_26f8);
  local_26f9 = 'F';
  QLatin1String::QLatin1String(&local_2710,"FIXED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1318,&local_26f9,&local_2710);
  local_2711 = 'F';
  QLatin1String::QLatin1String(&local_2728,"FLOAT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1300,&local_2711,&local_2728);
  local_2729 = 'F';
  QLatin1String::QLatin1String(&local_2740,"FOLLOWING");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_12e8,&local_2729,&local_2740);
  local_2741 = 'F';
  QLatin1String::QLatin1String(&local_2758,"FOR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_12d0,&local_2741,&local_2758);
  local_2759 = 'E';
  QLatin1String::QLatin1String(&local_2770,"EACH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_12b8,&local_2759,&local_2770);
  local_2771 = 'R';
  QLatin1String::QLatin1String(&local_2788,"ROW");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_12a0,&local_2771,&local_2788);
  local_2789 = 'F';
  QLatin1String::QLatin1String(&local_27a0,"FORCE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1288,&local_2789,&local_27a0);
  local_27a1 = 'F';
  QLatin1String::QLatin1String(&local_27b8,"FOREIGN");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1270,&local_27a1,&local_27b8);
  local_27b9 = 'F';
  QLatin1String::QLatin1String(&local_27d0,"FREETEXTTABLE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1258,&local_27b9,&local_27d0);
  local_27d1 = 'F';
  QLatin1String::QLatin1String(&local_27e8,"FROM");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1240,&local_27d1,&local_27e8);
  local_27e9 = 'F';
  QLatin1String::QLatin1String(&local_2800,"FULL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1228,&local_27e9,&local_2800);
  local_2801 = 'F';
  QLatin1String::QLatin1String(&local_2818,"FUNCTION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1210,&local_2801,&local_2818);
  local_2819 = 'G';
  QLatin1String::QLatin1String(&local_2830,"GEOMETRYCOLLECTION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_11f8,&local_2819,&local_2830);
  local_2831 = 'G';
  QLatin1String::QLatin1String(&local_2848,"GLOBAL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_11e0,&local_2831,&local_2848);
  local_2849 = 'G';
  QLatin1String::QLatin1String(&local_2860,"GOTO");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_11c8,&local_2849,&local_2860);
  local_2861 = 'G';
  QLatin1String::QLatin1String(&local_2878,"GRANT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_11b0,&local_2861,&local_2878);
  local_2879 = 'G';
  QLatin1String::QLatin1String(&local_2890,"GROUP");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1198,&local_2879,&local_2890);
  local_2891 = 'H';
  QLatin1String::QLatin1String(&local_28a8,"HANDLER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1180,&local_2891,&local_28a8);
  local_28a9 = 'H';
  QLatin1String::QLatin1String(&local_28c0,"HASH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1168,&local_28a9,&local_28c0);
  local_28c1 = 'H';
  QLatin1String::QLatin1String(&local_28d8,"HAVING");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1150,&local_28c1,&local_28d8);
  local_28d9 = 'H';
  QLatin1String::QLatin1String(&local_28f0,"HOLDLOCK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1138,&local_28d9,&local_28f0);
  local_28f1 = 'H';
  QLatin1String::QLatin1String(&local_2908,"HOUR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1120,&local_28f1,&local_2908);
  local_2909 = 'I';
  QLatin1String::QLatin1String(&local_2920,"IDENTITY_INSERT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1108,&local_2909,&local_2920);
  local_2921 = 'C';
  QLatin1String::QLatin1String(&local_2938,"COL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_10f0,&local_2921,&local_2938);
  local_2939 = 'I';
  QLatin1String::QLatin1String(&local_2950,"IF");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_10d8,&local_2939,&local_2950);
  local_2951 = 'I';
  QLatin1String::QLatin1String(&local_2968,"IGNORE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_10c0,&local_2951,&local_2968);
  local_2969 = 'I';
  QLatin1String::QLatin1String(&local_2980,"IMPORT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_10a8,&local_2969,&local_2980);
  local_2981 = 'I';
  QLatin1String::QLatin1String(&local_2998,"INDEX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1090,&local_2981,&local_2998);
  local_2999 = 'I';
  QLatin1String::QLatin1String(&local_29b0,"INFILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1078,&local_2999,&local_29b0);
  local_29b1 = 'I';
  QLatin1String::QLatin1String(&local_29c8,"INNER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1060,&local_29b1,&local_29c8);
  local_29c9 = 'I';
  QLatin1String::QLatin1String(&local_29e0,"INNODB");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1048,&local_29c9,&local_29e0);
  local_29e1 = 'I';
  QLatin1String::QLatin1String(&local_29f8,"INOUT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1030,&local_29e1,&local_29f8);
  local_29f9 = 'I';
  QLatin1String::QLatin1String(&local_2a10,"INSERT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1018,&local_29f9,&local_2a10);
  local_2a11 = 'I';
  QLatin1String::QLatin1String(&local_2a28,"INT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1000,&local_2a11,&local_2a28);
  local_2a29 = 'I';
  QLatin1String::QLatin1String(&local_2a40,"INTEGER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_fe8,&local_2a29,&local_2a40);
  local_2a41 = 'I';
  QLatin1String::QLatin1String(&local_2a58,"INTERSECT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_fd0,&local_2a41,&local_2a58);
  local_2a59 = 'I';
  QLatin1String::QLatin1String(&local_2a70,"INTERVAL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_fb8,&local_2a59,&local_2a70);
  local_2a71 = 'I';
  QLatin1String::QLatin1String(&local_2a88,"INTO");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_fa0,&local_2a71,&local_2a88);
  local_2a89 = 'I';
  QLatin1String::QLatin1String(&local_2aa0,"INVOKER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f88,&local_2a89,&local_2aa0);
  local_2aa1 = 'I';
  QLatin1String::QLatin1String(&local_2ab8,"ISOLATION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f70,&local_2aa1,&local_2ab8);
  local_2ab9 = 'I';
  QLatin1String::QLatin1String(&local_2ad0,"ITERATE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f58,&local_2ab9,&local_2ad0);
  local_2ad1 = 'J';
  QLatin1String::QLatin1String(&local_2ae8,"JOIN");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f40,&local_2ad1,&local_2ae8);
  local_2ae9 = 'K';
  QLatin1String::QLatin1String(&local_2b00,"KEYS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f28,&local_2ae9,&local_2b00);
  local_2b01 = 'K';
  QLatin1String::QLatin1String(&local_2b18,"KILL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_f10,&local_2b01,&local_2b18);
  local_2b19 = 'L';
  QLatin1String::QLatin1String(&local_2b30,"LANGUAGE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ef8,&local_2b19,&local_2b30);
  local_2b31 = 'L';
  QLatin1String::QLatin1String(&local_2b48,"LAST");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ee0,&local_2b31,&local_2b48);
  local_2b49 = 'L';
  QLatin1String::QLatin1String(&local_2b60,"LEAVE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ec8,&local_2b49,&local_2b60);
  local_2b61 = 'L';
  QLatin1String::QLatin1String(&local_2b78,"LEFT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_eb0,&local_2b61,&local_2b78);
  local_2b79 = 'L';
  QLatin1String::QLatin1String(&local_2b90,"LEVEL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e98,&local_2b79,&local_2b90);
  local_2b91 = 'L';
  QLatin1String::QLatin1String(&local_2ba8,"LIMIT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e80,&local_2b91,&local_2ba8);
  local_2ba9 = 'L';
  QLatin1String::QLatin1String(&local_2bc0,"LINENO");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e68,&local_2ba9,&local_2bc0);
  local_2bc1 = 'L';
  QLatin1String::QLatin1String(&local_2bd8,"LINES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e50,&local_2bc1,&local_2bd8);
  local_2bd9 = 'L';
  QLatin1String::QLatin1String(&local_2bf0,"LINESTRING");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e38,&local_2bd9,&local_2bf0);
  local_2bf1 = 'L';
  QLatin1String::QLatin1String(&local_2c08,"LOAD");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e20,&local_2bf1,&local_2c08);
  local_2c09 = 'L';
  QLatin1String::QLatin1String(&local_2c20,"LOCAL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e08,&local_2c09,&local_2c20);
  local_2c21 = 'L';
  QLatin1String::QLatin1String(&local_2c38,"LOCK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_df0,&local_2c21,&local_2c38);
  local_2c39 = 'L';
  QLatin1String::QLatin1String(&local_2c50,"LONGBLOB");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_dd8,&local_2c39,&local_2c50);
  local_2c51 = 'T';
  QLatin1String::QLatin1String(&local_2c68,"TEXT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_dc0,&local_2c51,&local_2c68);
  local_2c69 = 'L';
  QLatin1String::QLatin1String(&local_2c80,"LOOP");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_da8,&local_2c69,&local_2c80);
  local_2c81 = 'M';
  QLatin1String::QLatin1String(&local_2c98,"MATCHED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d90,&local_2c81,&local_2c98);
  local_2c99 = 'M';
  QLatin1String::QLatin1String(&local_2cb0,"MEDIUMBLOB");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d78,&local_2c99,&local_2cb0);
  local_2cb1 = 'I';
  QLatin1String::QLatin1String(&local_2cc8,"INT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d60,&local_2cb1,&local_2cc8);
  local_2cc9 = 'T';
  QLatin1String::QLatin1String(&local_2ce0,"TEXT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d48,&local_2cc9,&local_2ce0);
  local_2ce1 = 'M';
  QLatin1String::QLatin1String(&local_2cf8,"MERGE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d30,&local_2ce1,&local_2cf8);
  local_2cf9 = 'M';
  QLatin1String::QLatin1String(&local_2d10,"MIDDLEINT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d18,&local_2cf9,&local_2d10);
  local_2d11 = 'M';
  QLatin1String::QLatin1String(&local_2d28,"MINUTE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d00,&local_2d11,&local_2d28);
  local_2d29 = 'M';
  QLatin1String::QLatin1String(&local_2d40,"MODE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ce8,&local_2d29,&local_2d40);
  local_2d41 = 'M';
  QLatin1String::QLatin1String(&local_2d58,"MODIFIES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_cd0,&local_2d41,&local_2d58);
  local_2d59 = 'M';
  QLatin1String::QLatin1String(&local_2d70,"MODIFY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_cb8,&local_2d59,&local_2d70);
  local_2d71 = 'M';
  QLatin1String::QLatin1String(&local_2d88,"MONTH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ca0,&local_2d71,&local_2d88);
  local_2d89 = 'M';
  QLatin1String::QLatin1String(&local_2da0,"MULTILINESTRING");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c88,&local_2d89,&local_2da0);
  local_2da1 = 'P';
  QLatin1String::QLatin1String(&local_2db8,"POINT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c70,&local_2da1,&local_2db8);
  local_2db9 = 'P';
  QLatin1String::QLatin1String(&local_2dd0,"POLYGON");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c58,&local_2db9,&local_2dd0);
  local_2dd1 = 'N';
  QLatin1String::QLatin1String(&local_2de8,"NATIONAL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c40,&local_2dd1,&local_2de8);
  local_2de9 = 'N';
  QLatin1String::QLatin1String(&local_2e00,"NATURAL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c28,&local_2de9,&local_2e00);
  local_2e01 = 'N';
  QLatin1String::QLatin1String(&local_2e18,"NCHAR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_c10,&local_2e01,&local_2e18);
  local_2e19 = 'N';
  QLatin1String::QLatin1String(&local_2e30,"NEXT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_bf8,&local_2e19,&local_2e30);
  local_2e31 = 'N';
  QLatin1String::QLatin1String(&local_2e48,"NO");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_be0,&local_2e31,&local_2e48);
  local_2e49 = 'N';
  QLatin1String::QLatin1String(&local_2e60,"NONCLUSTERED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_bc8,&local_2e49,&local_2e60);
  local_2e61 = 'N';
  QLatin1String::QLatin1String(&local_2e78,"NULLIF");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_bb0,&local_2e61,&local_2e78);
  local_2e79 = 'N';
  QLatin1String::QLatin1String(&local_2e90,"NUMERIC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b98,&local_2e79,&local_2e90);
  local_2e91 = 'O';
  QLatin1String::QLatin1String(&local_2ea8,"OFF");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b80,&local_2e91,&local_2ea8);
  local_2ea9 = 'O';
  QLatin1String::QLatin1String(&local_2ec0,"OFFSETS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b68,&local_2ea9,&local_2ec0);
  local_2ec1 = 'O';
  QLatin1String::QLatin1String(&local_2ed8,"ON");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b50,&local_2ec1,&local_2ed8);
  local_2ed9 = 'O';
  QLatin1String::QLatin1String(&local_2ef0,"OPENDATASOURCE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b38,&local_2ed9,&local_2ef0);
  local_2ef1 = 'Q';
  QLatin1String::QLatin1String(&local_2f08,"QUERY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b20,&local_2ef1,&local_2f08);
  local_2f09 = 'R';
  QLatin1String::QLatin1String(&local_2f20,"ROWSET");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b08,&local_2f09,&local_2f20);
  local_2f21 = 'O';
  QLatin1String::QLatin1String(&local_2f38,"OPTIMIZE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_af0,&local_2f21,&local_2f38);
  local_2f39 = 'O';
  QLatin1String::QLatin1String(&local_2f50,"OPTIONALLY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ad8,&local_2f39,&local_2f50);
  local_2f51 = 'O';
  QLatin1String::QLatin1String(&local_2f68,"ORDER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_ac0,&local_2f51,&local_2f68);
  local_2f69 = 'O';
  QLatin1String::QLatin1String(&local_2f80,"OUTER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_aa8,&local_2f69,&local_2f80);
  local_2f81 = 'F';
  QLatin1String::QLatin1String(&local_2f98,"FILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a90,&local_2f81,&local_2f98);
  local_2f99 = 'O';
  QLatin1String::QLatin1String(&local_2fb0,"OVER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a78,&local_2f99,&local_2fb0);
  local_2fb1 = 'P';
  QLatin1String::QLatin1String(&local_2fc8,"PARTIAL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a60,&local_2fb1,&local_2fc8);
  local_2fc9 = 'P';
  QLatin1String::QLatin1String(&local_2fe0,"PARTITION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a48,&local_2fc9,&local_2fe0);
  local_2fe1 = 'P';
  QLatin1String::QLatin1String(&local_2ff8,"PERCENT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a30,&local_2fe1,&local_2ff8);
  local_2ff9 = 'P';
  QLatin1String::QLatin1String(&local_3010,"PIVOT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a18,&local_2ff9,&local_3010);
  local_3011 = 'P';
  QLatin1String::QLatin1String(&local_3028,"PLAN");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a00,&local_3011,&local_3028);
  local_3029 = 'P';
  QLatin1String::QLatin1String(&local_3040,"POINT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9e8,&local_3029,&local_3040);
  local_3041 = 'P';
  QLatin1String::QLatin1String(&local_3058,"POLYGON");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9d0,&local_3041,&local_3058);
  local_3059 = 'P';
  QLatin1String::QLatin1String(&local_3070,"PRECEDING");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9b8,&local_3059,&local_3070);
  local_3071 = 'P';
  QLatin1String::QLatin1String(&local_3088,"PRECISION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_9a0,&local_3071,&local_3088);
  local_3089 = 'P';
  QLatin1String::QLatin1String(&local_30a0,"PREPARE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_988,&local_3089,&local_30a0);
  local_30a1 = 'P';
  QLatin1String::QLatin1String(&local_30b8,"PREV");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_970,&local_30a1,&local_30b8);
  local_30b9 = 'P';
  QLatin1String::QLatin1String(&local_30d0,"PRIMARY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_958,&local_30b9,&local_30d0);
  local_30d1 = 'P';
  QLatin1String::QLatin1String(&local_30e8,"PRINT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_940,&local_30d1,&local_30e8);
  local_30e9 = 'P';
  QLatin1String::QLatin1String(&local_3100,"PRIVILEGES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_928,&local_30e9,&local_3100);
  local_3101 = 'P';
  QLatin1String::QLatin1String(&local_3118,"PROCEDURE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_910,&local_3101,&local_3118);
  local_3119 = 'P';
  QLatin1String::QLatin1String(&local_3130,"PUBLIC");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8f8,&local_3119,&local_3130);
  local_3131 = 'P';
  QLatin1String::QLatin1String(&local_3148,"PURGE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8e0,&local_3131,&local_3148);
  local_3149 = 'Q';
  QLatin1String::QLatin1String(&local_3160,"QUICK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8c8,&local_3149,&local_3160);
  local_3161 = 'R';
  QLatin1String::QLatin1String(&local_3178,"RAISERROR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_8b0,&local_3161,&local_3178);
  local_3179 = 'R';
  QLatin1String::QLatin1String(&local_3190,"READS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_898,&local_3179,&local_3190);
  local_3191 = 'R';
  QLatin1String::QLatin1String(&local_31a8,"REAL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_880,&local_3191,&local_31a8);
  local_31a9 = 'R';
  QLatin1String::QLatin1String(&local_31c0,"RECONFIGURE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_868,&local_31a9,&local_31c0);
  local_31c1 = 'R';
  QLatin1String::QLatin1String(&local_31d8,"REFERENCES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_850,&local_31c1,&local_31d8);
  local_31d9 = 'R';
  QLatin1String::QLatin1String(&local_31f0,"RELEASE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_838,&local_31d9,&local_31f0);
  local_31f1 = 'R';
  QLatin1String::QLatin1String(&local_3208,"RENAME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_820,&local_31f1,&local_3208);
  local_3209 = 'R';
  QLatin1String::QLatin1String(&local_3220,"REPEATABLE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_808,&local_3209,&local_3220);
  local_3221 = 'R';
  QLatin1String::QLatin1String(&local_3238,"REPLACE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7f0,&local_3221,&local_3238);
  local_3239 = 'R';
  QLatin1String::QLatin1String(&local_3250,"REPLICATION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7d8,&local_3239,&local_3250);
  local_3251 = 'R';
  QLatin1String::QLatin1String(&local_3268,"REQUIRE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7c0,&local_3251,&local_3268);
  local_3269 = 'R';
  QLatin1String::QLatin1String(&local_3280,"RESIGNAL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_7a8,&local_3269,&local_3280);
  local_3281 = 'R';
  QLatin1String::QLatin1String(&local_3298,"RESTORE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_790,&local_3281,&local_3298);
  local_3299 = 'R';
  QLatin1String::QLatin1String(&local_32b0,"RESTRICT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_778,&local_3299,&local_32b0);
  local_32b1 = 'R';
  QLatin1String::QLatin1String(&local_32c8,"RETURNS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_760,&local_32b1,&local_32c8);
  local_32c9 = 'R';
  QLatin1String::QLatin1String(&local_32e0,"REVOKE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_748,&local_32c9,&local_32e0);
  local_32e1 = 'R';
  QLatin1String::QLatin1String(&local_32f8,"RIGHT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_730,&local_32e1,&local_32f8);
  local_32f9 = 'R';
  QLatin1String::QLatin1String(&local_3310,"ROLLBACK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_718,&local_32f9,&local_3310);
  local_3311 = 'R';
  QLatin1String::QLatin1String(&local_3328,"ROUTINE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_700,&local_3311,&local_3328);
  local_3329 = 'R';
  QLatin1String::QLatin1String(&local_3340,"ROWCOUNT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_6e8,&local_3329,&local_3340);
  local_3341 = 'G';
  QLatin1String::QLatin1String(&local_3358,"GUIDCOL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_6d0,&local_3341,&local_3358);
  local_3359 = 'R';
  QLatin1String::QLatin1String(&local_3370,"RTREE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_6b8,&local_3359,&local_3370);
  local_3371 = 'R';
  QLatin1String::QLatin1String(&local_3388,"RULE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_6a0,&local_3371,&local_3388);
  local_3389 = 'S';
  QLatin1String::QLatin1String(&local_33a0,"SAVEPOINT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_688,&local_3389,&local_33a0);
  local_33a1 = 'S';
  QLatin1String::QLatin1String(&local_33b8,"SCHEMA");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_670,&local_33a1,&local_33b8);
  local_33b9 = 'S';
  QLatin1String::QLatin1String(&local_33d0,"SECOND");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_658,&local_33b9,&local_33d0);
  local_33d1 = 'S';
  QLatin1String::QLatin1String(&local_33e8,"SELECT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_640,&local_33d1,&local_33e8);
  local_33e9 = 'S';
  QLatin1String::QLatin1String(&local_3400,"SERIALIZABLE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_628,&local_33e9,&local_3400);
  local_3401 = 'S';
  QLatin1String::QLatin1String(&local_3418,"SESSION_USER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_610,&local_3401,&local_3418);
  local_3419 = 'S';
  QLatin1String::QLatin1String(&local_3430,"SETUSER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5f8,&local_3419,&local_3430);
  local_3431 = 'S';
  QLatin1String::QLatin1String(&local_3448,"SHARE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5e0,&local_3431,&local_3448);
  local_3449 = 'S';
  QLatin1String::QLatin1String(&local_3460,"SHOW");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5c8,&local_3449,&local_3460);
  local_3461 = 'S';
  QLatin1String::QLatin1String(&local_3478,"SHUTDOWN");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_5b0,&local_3461,&local_3478);
  local_3479 = 'S';
  QLatin1String::QLatin1String(&local_3490,"SIMPLE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_598,&local_3479,&local_3490);
  local_3491 = 'S';
  QLatin1String::QLatin1String(&local_34a8,"SMALLINT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_580,&local_3491,&local_34a8);
  local_34a9 = 'S';
  QLatin1String::QLatin1String(&local_34c0,"SNAPSHOT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_568,&local_34a9,&local_34c0);
  local_34c1 = 'S';
  QLatin1String::QLatin1String(&local_34d8,"SOME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_550,&local_34c1,&local_34d8);
  local_34d9 = 'S';
  QLatin1String::QLatin1String(&local_34f0,"SONAME");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_538,&local_34d9,&local_34f0);
  local_34f1 = 'S';
  QLatin1String::QLatin1String(&local_3508,"SQL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_520,&local_34f1,&local_3508);
  local_3509 = 'S';
  QLatin1String::QLatin1String(&local_3520,"STARTING");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_508,&local_3509,&local_3520);
  local_3521 = 'S';
  QLatin1String::QLatin1String(&local_3538,"STATISTICS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4f0,&local_3521,&local_3538);
  local_3539 = 'S';
  QLatin1String::QLatin1String(&local_3550,"STATUS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4d8,&local_3539,&local_3550);
  local_3551 = 'S';
  QLatin1String::QLatin1String(&local_3568,"STRIPED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4c0,&local_3551,&local_3568);
  local_3569 = 'S';
  QLatin1String::QLatin1String(&local_3580,"SYSTEM_USER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_4a8,&local_3569,&local_3580);
  local_3581 = 'T';
  QLatin1String::QLatin1String(&local_3598,"TABLES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_490,&local_3581,&local_3598);
  local_3599 = 'T';
  QLatin1String::QLatin1String(&local_35b0,"TABLESPACE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_478,&local_3599,&local_35b0);
  local_35b1 = 'T';
  QLatin1String::QLatin1String(&local_35c8,"TEMPORARY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_460,&local_35b1,&local_35c8);
  local_35c9 = 'T';
  QLatin1String::QLatin1String(&local_35e0,"TABLE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_448,&local_35c9,&local_35e0);
  local_35e1 = 'T';
  QLatin1String::QLatin1String(&local_35f8,"TERMINATED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_430,&local_35e1,&local_35f8);
  local_35f9 = 'T';
  QLatin1String::QLatin1String(&local_3610,"TEXTSIZE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_418,&local_35f9,&local_3610);
  local_3611 = 'T';
  QLatin1String::QLatin1String(&local_3628,"THEN");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_400,&local_3611,&local_3628);
  local_3629 = 'T';
  QLatin1String::QLatin1String(&local_3640,"TIMESTAMP");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3e8,&local_3629,&local_3640);
  local_3641 = 'T';
  QLatin1String::QLatin1String(&local_3658,"TINYBLOB");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3d0,&local_3641,&local_3658);
  local_3659 = 'I';
  QLatin1String::QLatin1String(&local_3670,"INT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3b8,&local_3659,&local_3670);
  local_3671 = 'T';
  QLatin1String::QLatin1String(&local_3688,"TEXT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3a0,&local_3671,&local_3688);
  local_3689 = 'T';
  QLatin1String::QLatin1String(&local_36a0,"TOP");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_388,&local_3689,&local_36a0);
  local_36a1 = 'T';
  QLatin1String::QLatin1String(&local_36b8,"TRANSACTIONS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_370,&local_36a1,&local_36b8);
  local_36b9 = 'T';
  QLatin1String::QLatin1String(&local_36d0,"TRIGGER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_358,&local_36b9,&local_36d0);
  local_36d1 = 'T';
  QLatin1String::QLatin1String(&local_36e8,"TRUNCATE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_340,&local_36d1,&local_36e8);
  local_36e9 = 'T';
  QLatin1String::QLatin1String(&local_3700,"TSEQUAL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_328,&local_36e9,&local_3700);
  local_3701 = 'T';
  QLatin1String::QLatin1String(&local_3718,"TYPES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_310,&local_3701,&local_3718);
  local_3719 = 'U';
  QLatin1String::QLatin1String(&local_3730,"UNBOUNDED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2f8,&local_3719,&local_3730);
  local_3731 = 'U';
  QLatin1String::QLatin1String(&local_3748,"UNCOMMITTED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2e0,&local_3731,&local_3748);
  local_3749 = 'U';
  QLatin1String::QLatin1String(&local_3760,"UNDEFINED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2c8,&local_3749,&local_3760);
  local_3761 = 'U';
  QLatin1String::QLatin1String(&local_3778,"UNION");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_2b0,&local_3761,&local_3778);
  local_3779 = 'U';
  QLatin1String::QLatin1String(&local_3790,"UNIQUE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_298,&local_3779,&local_3790);
  local_3791 = 'U';
  QLatin1String::QLatin1String(&local_37a8,"UNLOCK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_280,&local_3791,&local_37a8);
  local_37a9 = 'U';
  QLatin1String::QLatin1String(&local_37c0,"UNPIVOT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_268,&local_37a9,&local_37c0);
  local_37c1 = 'U';
  QLatin1String::QLatin1String(&local_37d8,"UNSIGNED");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_250,&local_37c1,&local_37d8);
  local_37d9 = 'U';
  QLatin1String::QLatin1String(&local_37f0,"UPDATETEXT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_238,&local_37d9,&local_37f0);
  local_37f1 = 'U';
  QLatin1String::QLatin1String(&local_3808,"USAGE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_220,&local_37f1,&local_3808);
  local_3809 = 'U';
  QLatin1String::QLatin1String(&local_3820,"USE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_208,&local_3809,&local_3820);
  local_3821 = 'U';
  QLatin1String::QLatin1String(&local_3838,"USER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1f0,&local_3821,&local_3838);
  local_3839 = 'U';
  QLatin1String::QLatin1String(&local_3850,"USING");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1d8,&local_3839,&local_3850);
  local_3851 = 'V';
  QLatin1String::QLatin1String(&local_3868,"VALUES");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1c0,&local_3851,&local_3868);
  local_3869 = 'V';
  QLatin1String::QLatin1String(&local_3880,"VARBINARY");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_1a8,&local_3869,&local_3880);
  local_3881 = 'C';
  QLatin1String::QLatin1String(&local_3898,"CHAR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_190,&local_3881,&local_3898);
  local_3899 = 'C';
  QLatin1String::QLatin1String(&local_38b0,"CHARACTER");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_178,&local_3899,&local_38b0);
  local_38b1 = 'Y';
  QLatin1String::QLatin1String(&local_38c8,"YING");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_160,&local_38b1,&local_38c8);
  local_38c9 = 'V';
  QLatin1String::QLatin1String(&local_38e0,"VIEW");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_148,&local_38c9,&local_38e0);
  local_38e1 = 'W';
  QLatin1String::QLatin1String(&local_38f8,"WAITFOR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_130,&local_38e1,&local_38f8);
  local_38f9 = 'W';
  QLatin1String::QLatin1String(&local_3910,"WARNINGS");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_118,&local_38f9,&local_3910);
  local_3911 = 'W';
  QLatin1String::QLatin1String(&local_3928,"WHEN");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_100,&local_3911,&local_3928);
  local_3929 = 'W';
  QLatin1String::QLatin1String(&local_3940,"WHERE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_e8,&local_3929,&local_3940);
  local_3941 = 'W';
  QLatin1String::QLatin1String(&local_3958,"WHILE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_d0,&local_3941,&local_3958);
  local_3959 = 'W';
  QLatin1String::QLatin1String(&local_3970,"WITH");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_b8,&local_3959,&local_3970);
  local_3971 = 'R';
  QLatin1String::QLatin1String(&local_3988,"ROLLUP");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_a0,&local_3971,&local_3988);
  local_3989 = 'I';
  QLatin1String::QLatin1String(&local_39a0,"IN");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_88,&local_3989,&local_39a0);
  local_39a1 = 'W';
  QLatin1String::QLatin1String(&local_39b8,"WORK");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_70,&local_39a1,&local_39b8);
  local_39b9 = 'W';
  QLatin1String::QLatin1String(&local_39d0,"WRITETEXT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_58,&local_39b9,&local_39d0);
  local_39d1 = 'Y';
  QLatin1String::QLatin1String(&local_39e8,"YEAR");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_40,&local_39d1,&local_39e8);
  local_28 = &local_1d08;
  local_20 = 0x134;
  list_01._M_len = 0x134;
  list_01._M_array = local_28;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_18,list_01);
  QMultiHash<char,_QLatin1String>::operator=(&sql_keywords,&local_18);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_18);
  memset(&local_39f8,0,0x10);
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_39f8);
  QMultiHash<char,_QLatin1String>::operator=(&sql_types,&local_39f8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_39f8);
  local_3a61 = 'A';
  QLatin1String::QLatin1String(&local_3a78,"TRUE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&local_3a60,&local_3a61,&local_3a78);
  local_3a79 = 'F';
  QLatin1String::QLatin1String(&local_3a90,"FALSE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3a48,&local_3a79,&local_3a90);
  local_3a91 = 'N';
  QLatin1String::QLatin1String(&local_3aa8,"NULL");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3a30,&local_3a91,&local_3aa8);
  local_3a18 = &local_3a60;
  local_3a10 = 3;
  list_00._M_len = 3;
  list_00._M_array = local_3a18;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_3a08,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&sql_literals,&local_3a08);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_3a08);
  local_3c31 = 'A';
  QLatin1String::QLatin1String(&local_3c48,"AVG");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&local_3c30,&local_3c31,&local_3c48);
  local_3c49 = 'C';
  QLatin1String::QLatin1String(&local_3c60,"COUNT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3c18,&local_3c49,&local_3c60);
  local_3c61 = 'F';
  QLatin1String::QLatin1String(&local_3c78,"FIRST");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3c00,&local_3c61,&local_3c78);
  local_3c79 = 'F';
  QLatin1String::QLatin1String(&local_3c90,"FORMAT");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3be8,&local_3c79,&local_3c90);
  local_3c91 = 'L';
  QLatin1String::QLatin1String(&local_3ca8,"LAST");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3bd0,&local_3c91,&local_3ca8);
  local_3ca9 = 'L';
  QLatin1String::QLatin1String(&local_3cc0,"LCASE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3bb8,&local_3ca9,&local_3cc0);
  local_3cc1 = 'L';
  QLatin1String::QLatin1String(&local_3cd8,"LEN");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3ba0,&local_3cc1,&local_3cd8);
  local_3cd9 = 'M';
  QLatin1String::QLatin1String(&local_3cf0,"MAX");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3b88,&local_3cd9,&local_3cf0);
  local_3cf1 = 'M';
  QLatin1String::QLatin1String(&local_3d08,"MID");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3b70,&local_3cf1,&local_3d08);
  local_3d09 = 'M';
  QLatin1String::QLatin1String(&local_3d20,"MIN");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3b58,&local_3d09,&local_3d20);
  local_3d21 = 'M';
  QLatin1String::QLatin1String(&local_3d38,"MOD");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3b40,&local_3d21,&local_3d38);
  local_3d39 = 'N';
  QLatin1String::QLatin1String(&local_3d50,"NOW");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3b28,&local_3d39,&local_3d50);
  local_3d51 = 'R';
  QLatin1String::QLatin1String(&local_3d68,"ROUND");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3b10,&local_3d51,&local_3d68);
  local_3d69 = 'S';
  QLatin1String::QLatin1String(&local_3d80,"SUM");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3af8,&local_3d69,&local_3d80);
  local_3d81 = 'U';
  QLatin1String::QLatin1String(&local_3d98,"UCASE");
  std::pair<char,_QLatin1String>::pair<char,_QLatin1String,_true>
            (&pStack_3ae0,&local_3d81,&local_3d98);
  local_3ac8 = &local_3c30;
  local_3ac0 = 0xf;
  list._M_len = 0xf;
  list._M_array = local_3ac8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_3ab8,list);
  QMultiHash<char,_QLatin1String>::operator=(&sql_builtin,&local_3ab8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_3ab8);
  memset(&local_3da8,0,0x10);
  QMultiHash<char,_QLatin1String>::QMultiHash(&local_3da8);
  QMultiHash<char,_QLatin1String>::operator=(&sql_other,&local_3da8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_3da8);
  return;
}

Assistant:

void initSQLData() {
    sql_keywords = {{('A'), QLatin1String("ACTION")},
                    {('A'), QLatin1String("ADD")},
                    {('A'), QLatin1String("AFTER")},
                    {('A'), QLatin1String("ALGORITHM")},
                    {('A'), QLatin1String("ALL")},
                    {('A'), QLatin1String("ALTER")},
                    {('A'), QLatin1String("ANALYZE")},
                    {('A'), QLatin1String("ANY")},
                    {('A'), QLatin1String("APPLY")},
                    {('A'), QLatin1String("AS")},
                    {('A'), QLatin1String("ASC")},
                    {('A'), QLatin1String("AUTHORIZATION")},
                    {('A'), QLatin1String("AUTO_INCREMENT")},
                    {('B'), QLatin1String("BACKUP")},
                    {('B'), QLatin1String("BDB")},
                    {('B'), QLatin1String("BEGIN")},
                    {('B'), QLatin1String("BERKELEYDB")},
                    {('B'), QLatin1String("BIGINT")},
                    {('B'), QLatin1String("BINARY")},
                    {('B'), QLatin1String("BIT")},
                    {('B'), QLatin1String("BLOB")},
                    {('B'), QLatin1String("BOOL")},
                    {('B'), QLatin1String("BOOLEAN")},
                    {('B'), QLatin1String("BREAK")},
                    {('B'), QLatin1String("BROWSE")},
                    {('B'), QLatin1String("BTREE")},
                    {('B'), QLatin1String("BULK")},
                    {('B'), QLatin1String("BY")},
                    {('C'), QLatin1String("CALL")},
                    {('C'), QLatin1String("CASCADED")},
                    {('C'), QLatin1String("CASE")},
                    {('C'), QLatin1String("CHAIN")},
                    {('C'), QLatin1String("CHARACTER")},
                    {('S'), QLatin1String("SET")},
                    {('C'), QLatin1String("CHECKPOINT")},
                    {('C'), QLatin1String("CLOSE")},
                    {('C'), QLatin1String("CLUSTERED")},
                    {('C'), QLatin1String("COALESCE")},
                    {('C'), QLatin1String("COLLATE")},
                    {('C'), QLatin1String("COLUMNS")},
                    {('C'), QLatin1String("COMMENT")},
                    {('C'), QLatin1String("COMMITTED")},
                    {('C'), QLatin1String("COMPUTE")},
                    {('C'), QLatin1String("CONNECT")},
                    {('C'), QLatin1String("CONSISTENT")},
                    {('C'), QLatin1String("CONSTRAINT")},
                    {('C'), QLatin1String("CONTAINSTABLE")},
                    {('C'), QLatin1String("CONTINUE")},
                    {('C'), QLatin1String("CONVERT")},
                    {('C'), QLatin1String("CREATE")},
                    {('C'), QLatin1String("CROSS")},
                    {('C'), QLatin1String("CURRENT_DATE")},
                    {('_'), QLatin1String("_TIME")},
                    {('_'), QLatin1String("_TIMESTAMP")},
                    {('_'), QLatin1String("_USER")},
                    {('C'), QLatin1String("CURSOR")},
                    {('C'), QLatin1String("CYCLE")},
                    {('D'), QLatin1String("DATABASES")},
                    {('D'), QLatin1String("DATETIME")},
                    {('D'), QLatin1String("DAY")},
                    {('D'), QLatin1String("DBCC")},
                    {('D'), QLatin1String("DEALLOCATE")},
                    {('D'), QLatin1String("DEC")},
                    {('D'), QLatin1String("DECIMAL")},
                    {('D'), QLatin1String("DECLARE")},
                    {('D'), QLatin1String("DEFAULT")},
                    {('D'), QLatin1String("DEFINER")},
                    {('D'), QLatin1String("DELAYED")},
                    {('D'), QLatin1String("DELETE")},
                    {('D'), QLatin1String("DELIMITERS")},
                    {('D'), QLatin1String("DENY")},
                    {('D'), QLatin1String("DESC")},
                    {('D'), QLatin1String("DESCRIBE")},
                    {('D'), QLatin1String("DETERMINISTIC")},
                    {('D'), QLatin1String("DISABLE")},
                    {('D'), QLatin1String("DISCARD")},
                    {('D'), QLatin1String("DISK")},
                    {('D'), QLatin1String("DISTINCT")},
                    {('D'), QLatin1String("DISTINCTROW")},
                    {('D'), QLatin1String("DISTRIBUTED")},
                    {('D'), QLatin1String("DO")},
                    {('D'), QLatin1String("DOUBLE")},
                    {('D'), QLatin1String("DROP")},
                    {('D'), QLatin1String("DUMMY")},
                    {('D'), QLatin1String("DUMPFILE")},
                    {('D'), QLatin1String("DUPLICATE")},
                    {('E'), QLatin1String("ELSEIF")},
                    {('E'), QLatin1String("ENABLE")},
                    {('E'), QLatin1String("ENCLOSED")},
                    {('E'), QLatin1String("END")},
                    {('E'), QLatin1String("ENGINE")},
                    {('E'), QLatin1String("ENUM")},
                    {('E'), QLatin1String("ERRLVL")},
                    {('E'), QLatin1String("ERRORS")},
                    {('E'), QLatin1String("ESCAPED")},
                    {('E'), QLatin1String("EXCEPT")},
                    {('E'), QLatin1String("EXECUTE")},
                    {('E'), QLatin1String("EXISTS")},
                    {('E'), QLatin1String("EXIT")},
                    {('E'), QLatin1String("EXPLAIN")},
                    {('E'), QLatin1String("EXTENDED")},
                    {('F'), QLatin1String("FETCH")},
                    {('F'), QLatin1String("FIELDS")},
                    {('F'), QLatin1String("FILE")},
                    {('F'), QLatin1String("FILLFACTOR")},
                    {('F'), QLatin1String("FIRST")},
                    {('F'), QLatin1String("FIXED")},
                    {('F'), QLatin1String("FLOAT")},
                    {('F'), QLatin1String("FOLLOWING")},
                    {('F'), QLatin1String("FOR")},
                    {('E'), QLatin1String("EACH")},
                    {('R'), QLatin1String("ROW")},
                    {('F'), QLatin1String("FORCE")},
                    {('F'), QLatin1String("FOREIGN")},
                    {('F'), QLatin1String("FREETEXTTABLE")},
                    {('F'), QLatin1String("FROM")},
                    {('F'), QLatin1String("FULL")},
                    {('F'), QLatin1String("FUNCTION")},
                    {('G'), QLatin1String("GEOMETRYCOLLECTION")},
                    {('G'), QLatin1String("GLOBAL")},
                    {('G'), QLatin1String("GOTO")},
                    {('G'), QLatin1String("GRANT")},
                    {('G'), QLatin1String("GROUP")},
                    {('H'), QLatin1String("HANDLER")},
                    {('H'), QLatin1String("HASH")},
                    {('H'), QLatin1String("HAVING")},
                    {('H'), QLatin1String("HOLDLOCK")},
                    {('H'), QLatin1String("HOUR")},
                    {('I'), QLatin1String("IDENTITY_INSERT")},
                    {('C'), QLatin1String("COL")},
                    {('I'), QLatin1String("IF")},
                    {('I'), QLatin1String("IGNORE")},
                    {('I'), QLatin1String("IMPORT")},
                    {('I'), QLatin1String("INDEX")},
                    {('I'), QLatin1String("INFILE")},
                    {('I'), QLatin1String("INNER")},
                    {('I'), QLatin1String("INNODB")},
                    {('I'), QLatin1String("INOUT")},
                    {('I'), QLatin1String("INSERT")},
                    {('I'), QLatin1String("INT")},
                    {('I'), QLatin1String("INTEGER")},
                    {('I'), QLatin1String("INTERSECT")},
                    {('I'), QLatin1String("INTERVAL")},
                    {('I'), QLatin1String("INTO")},
                    {('I'), QLatin1String("INVOKER")},
                    {('I'), QLatin1String("ISOLATION")},
                    {('I'), QLatin1String("ITERATE")},
                    {('J'), QLatin1String("JOIN")},
                    {('K'), QLatin1String("KEYS")},
                    {('K'), QLatin1String("KILL")},
                    {('L'), QLatin1String("LANGUAGE")},
                    {('L'), QLatin1String("LAST")},
                    {('L'), QLatin1String("LEAVE")},
                    {('L'), QLatin1String("LEFT")},
                    {('L'), QLatin1String("LEVEL")},
                    {('L'), QLatin1String("LIMIT")},
                    {('L'), QLatin1String("LINENO")},
                    {('L'), QLatin1String("LINES")},
                    {('L'), QLatin1String("LINESTRING")},
                    {('L'), QLatin1String("LOAD")},
                    {('L'), QLatin1String("LOCAL")},
                    {('L'), QLatin1String("LOCK")},
                    {('L'), QLatin1String("LONGBLOB")},
                    {('T'), QLatin1String("TEXT")},
                    {('L'), QLatin1String("LOOP")},
                    {('M'), QLatin1String("MATCHED")},
                    {('M'), QLatin1String("MEDIUMBLOB")},
                    {('I'), QLatin1String("INT")},
                    {('T'), QLatin1String("TEXT")},
                    {('M'), QLatin1String("MERGE")},
                    {('M'), QLatin1String("MIDDLEINT")},
                    {('M'), QLatin1String("MINUTE")},
                    {('M'), QLatin1String("MODE")},
                    {('M'), QLatin1String("MODIFIES")},
                    {('M'), QLatin1String("MODIFY")},
                    {('M'), QLatin1String("MONTH")},
                    {('M'), QLatin1String("MULTILINESTRING")},
                    {('P'), QLatin1String("POINT")},
                    {('P'), QLatin1String("POLYGON")},
                    {('N'), QLatin1String("NATIONAL")},
                    {('N'), QLatin1String("NATURAL")},
                    {('N'), QLatin1String("NCHAR")},
                    {('N'), QLatin1String("NEXT")},
                    {('N'), QLatin1String("NO")},
                    {('N'), QLatin1String("NONCLUSTERED")},
                    {('N'), QLatin1String("NULLIF")},
                    {('N'), QLatin1String("NUMERIC")},
                    {('O'), QLatin1String("OFF")},
                    {('O'), QLatin1String("OFFSETS")},
                    {('O'), QLatin1String("ON")},
                    {('O'), QLatin1String("OPENDATASOURCE")},
                    {('Q'), QLatin1String("QUERY")},
                    {('R'), QLatin1String("ROWSET")},
                    {('O'), QLatin1String("OPTIMIZE")},
                    {('O'), QLatin1String("OPTIONALLY")},
                    {('O'), QLatin1String("ORDER")},
                    {('O'), QLatin1String("OUTER")},
                    {('F'), QLatin1String("FILE")},
                    {('O'), QLatin1String("OVER")},
                    {('P'), QLatin1String("PARTIAL")},
                    {('P'), QLatin1String("PARTITION")},
                    {('P'), QLatin1String("PERCENT")},
                    {('P'), QLatin1String("PIVOT")},
                    {('P'), QLatin1String("PLAN")},
                    {('P'), QLatin1String("POINT")},
                    {('P'), QLatin1String("POLYGON")},
                    {('P'), QLatin1String("PRECEDING")},
                    {('P'), QLatin1String("PRECISION")},
                    {('P'), QLatin1String("PREPARE")},
                    {('P'), QLatin1String("PREV")},
                    {('P'), QLatin1String("PRIMARY")},
                    {('P'), QLatin1String("PRINT")},
                    {('P'), QLatin1String("PRIVILEGES")},
                    {('P'), QLatin1String("PROCEDURE")},
                    {('P'), QLatin1String("PUBLIC")},
                    {('P'), QLatin1String("PURGE")},
                    {('Q'), QLatin1String("QUICK")},
                    {('R'), QLatin1String("RAISERROR")},
                    {('R'), QLatin1String("READS")},
                    {('R'), QLatin1String("REAL")},
                    {('R'), QLatin1String("RECONFIGURE")},
                    {('R'), QLatin1String("REFERENCES")},
                    {('R'), QLatin1String("RELEASE")},
                    {('R'), QLatin1String("RENAME")},
                    {('R'), QLatin1String("REPEATABLE")},
                    {('R'), QLatin1String("REPLACE")},
                    {('R'), QLatin1String("REPLICATION")},
                    {('R'), QLatin1String("REQUIRE")},
                    {('R'), QLatin1String("RESIGNAL")},
                    {('R'), QLatin1String("RESTORE")},
                    {('R'), QLatin1String("RESTRICT")},
                    {('R'), QLatin1String("RETURNS")},
                    {('R'), QLatin1String("REVOKE")},
                    {('R'), QLatin1String("RIGHT")},
                    {('R'), QLatin1String("ROLLBACK")},
                    {('R'), QLatin1String("ROUTINE")},
                    {('R'), QLatin1String("ROWCOUNT")},
                    {('G'), QLatin1String("GUIDCOL")},
                    {('R'), QLatin1String("RTREE")},
                    {('R'), QLatin1String("RULE")},
                    {('S'), QLatin1String("SAVEPOINT")},
                    {('S'), QLatin1String("SCHEMA")},
                    {('S'), QLatin1String("SECOND")},
                    {('S'), QLatin1String("SELECT")},
                    {('S'), QLatin1String("SERIALIZABLE")},
                    {('S'), QLatin1String("SESSION_USER")},
                    {('S'), QLatin1String("SETUSER")},
                    {('S'), QLatin1String("SHARE")},
                    {('S'), QLatin1String("SHOW")},
                    {('S'), QLatin1String("SHUTDOWN")},
                    {('S'), QLatin1String("SIMPLE")},
                    {('S'), QLatin1String("SMALLINT")},
                    {('S'), QLatin1String("SNAPSHOT")},
                    {('S'), QLatin1String("SOME")},
                    {('S'), QLatin1String("SONAME")},
                    {('S'), QLatin1String("SQL")},
                    {('S'), QLatin1String("STARTING")},
                    {('S'), QLatin1String("STATISTICS")},
                    {('S'), QLatin1String("STATUS")},
                    {('S'), QLatin1String("STRIPED")},
                    {('S'), QLatin1String("SYSTEM_USER")},
                    {('T'), QLatin1String("TABLES")},
                    {('T'), QLatin1String("TABLESPACE")},
                    {('T'), QLatin1String("TEMPORARY")},
                    {('T'), QLatin1String("TABLE")},
                    {('T'), QLatin1String("TERMINATED")},
                    {('T'), QLatin1String("TEXTSIZE")},
                    {('T'), QLatin1String("THEN")},
                    {('T'), QLatin1String("TIMESTAMP")},
                    {('T'), QLatin1String("TINYBLOB")},
                    {('I'), QLatin1String("INT")},
                    {('T'), QLatin1String("TEXT")},
                    {('T'), QLatin1String("TOP")},
                    {('T'), QLatin1String("TRANSACTIONS")},
                    {('T'), QLatin1String("TRIGGER")},
                    {('T'), QLatin1String("TRUNCATE")},
                    {('T'), QLatin1String("TSEQUAL")},
                    {('T'), QLatin1String("TYPES")},
                    {('U'), QLatin1String("UNBOUNDED")},
                    {('U'), QLatin1String("UNCOMMITTED")},
                    {('U'), QLatin1String("UNDEFINED")},
                    {('U'), QLatin1String("UNION")},
                    {('U'), QLatin1String("UNIQUE")},
                    {('U'), QLatin1String("UNLOCK")},
                    {('U'), QLatin1String("UNPIVOT")},
                    {('U'), QLatin1String("UNSIGNED")},
                    {('U'), QLatin1String("UPDATETEXT")},
                    {('U'), QLatin1String("USAGE")},
                    {('U'), QLatin1String("USE")},
                    {('U'), QLatin1String("USER")},
                    {('U'), QLatin1String("USING")},
                    {('V'), QLatin1String("VALUES")},
                    {('V'), QLatin1String("VARBINARY")},
                    {('C'), QLatin1String("CHAR")},
                    {('C'), QLatin1String("CHARACTER")},
                    {('Y'), QLatin1String("YING")},
                    {('V'), QLatin1String("VIEW")},
                    {('W'), QLatin1String("WAITFOR")},
                    {('W'), QLatin1String("WARNINGS")},
                    {('W'), QLatin1String("WHEN")},
                    {('W'), QLatin1String("WHERE")},
                    {('W'), QLatin1String("WHILE")},
                    {('W'), QLatin1String("WITH")},
                    {('R'), QLatin1String("ROLLUP")},
                    {('I'), QLatin1String("IN")},
                    {('W'), QLatin1String("WORK")},
                    {('W'), QLatin1String("WRITETEXT")},
                    {('Y'), QLatin1String("YEAR")}};

    sql_types = {

    };

    sql_literals = {
        {('A'), QLatin1String("TRUE")},
        {('F'), QLatin1String("FALSE")},
        {('N'), QLatin1String("NULL")},
    };

    sql_builtin = {
        {('A'), QLatin1String("AVG")},   {('C'), QLatin1String("COUNT")},
        {('F'), QLatin1String("FIRST")}, {('F'), QLatin1String("FORMAT")},
        {('L'), QLatin1String("LAST")},  {('L'), QLatin1String("LCASE")},
        {('L'), QLatin1String("LEN")},   {('M'), QLatin1String("MAX")},
        {('M'), QLatin1String("MID")},   {('M'), QLatin1String("MIN")},
        {('M'), QLatin1String("MOD")},   {('N'), QLatin1String("NOW")},
        {('R'), QLatin1String("ROUND")}, {('S'), QLatin1String("SUM")},
        {('U'), QLatin1String("UCASE")}};

    sql_other = {

    };
}